

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O0

void amrex::Geometry::ResetDefaultProbDomain(RealBox *rb)

{
  AMReX *this;
  Geometry *this_00;
  Real *pRVar1;
  RealBox *in_RDI;
  Geometry *gg;
  
  this = AMReX::top();
  this_00 = AMReX::getDefaultGeometry(this);
  pRVar1 = RealBox::lo(in_RDI);
  RealBox::setLo(&this_00->prob_domain,pRVar1);
  pRVar1 = RealBox::hi(in_RDI);
  RealBox::setHi(&this_00->prob_domain,pRVar1);
  pRVar1 = RealBox::lo(in_RDI);
  CoordSys::SetOffset(&this_00->super_CoordSys,pRVar1);
  return;
}

Assistant:

void
Geometry::ResetDefaultProbDomain (const RealBox& rb) noexcept
{
    Geometry* gg = AMReX::top()->getDefaultGeometry();
    gg->prob_domain.setLo(rb.lo());
    gg->prob_domain.setHi(rb.hi());
    gg->SetOffset(rb.lo());
}